

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIf.c
# Opt level: O1

void Gia_ManTransferPacking(Gia_Man_t *p,Gia_Man_t *pGia)

{
  int Entry;
  int iVar1;
  Vec_Int_t *pVVar2;
  int *piVar3;
  Vec_Int_t *pVVar4;
  long lVar5;
  int iVar6;
  uint uVar7;
  ulong uVar8;
  int Entry_00;
  
  pVVar2 = pGia->vPacking;
  if (pVVar2 != (Vec_Int_t *)0x0) {
    uVar7 = pVVar2->nSize;
    if ((int)uVar7 < 1) {
LAB_00215693:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                    ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
    }
    Entry = *pVVar2->pArray;
    pVVar2 = (Vec_Int_t *)malloc(0x10);
    uVar8 = 0x10;
    if (0x10 < uVar7) {
      uVar8 = (ulong)uVar7;
    }
    pVVar2->nSize = 0;
    pVVar2->nCap = (int)uVar8;
    piVar3 = (int *)malloc(uVar8 << 2);
    pVVar2->pArray = piVar3;
    Vec_IntPush(pVVar2,Entry);
    pVVar4 = pGia->vPacking;
    iVar6 = 0;
    if (1 < pVVar4->nSize) {
      uVar7 = 1;
      iVar6 = 0;
      do {
        if ((int)uVar7 < 0) goto LAB_00215693;
        uVar8 = (ulong)uVar7;
        Entry_00 = pVVar4->pArray[uVar8];
        if (2 < Entry_00 - 1U) {
          __assert_fail("Entry > 0 && Entry < 4",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaIf.c"
                        ,0x850,"void Gia_ManTransferPacking(Gia_Man_t *, Gia_Man_t *)");
        }
        Vec_IntPush(pVVar2,Entry_00);
        if (0 < Entry_00) {
          do {
            if (((int)uVar8 < -1) || (pGia->vPacking->nSize <= (int)uVar8 + 1)) goto LAB_00215693;
            iVar1 = pGia->vPacking->pArray[uVar8 + 1];
            lVar5 = (long)iVar1;
            if ((lVar5 < 0) || (pGia->nObjs <= iVar1)) {
LAB_002156b2:
              __assert_fail("v >= 0 && v < p->nObjs",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                            ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
            }
            uVar7 = pGia->pObjs[lVar5].Value;
            if ((int)uVar7 < 0) {
              __assert_fail("Lit >= 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                            ,0x12f,"int Abc_Lit2Var(int)");
            }
            uVar7 = uVar7 >> 1;
            if (p->nObjs <= (int)uVar7) goto LAB_002156b2;
            if (pGia->vMapping->nSize <= iVar1) goto LAB_00215693;
            if (pGia->vMapping->pArray[lVar5] == 0) {
              __assert_fail("Gia_ObjIsLut(pGia, Gia_ObjId(pGia, pObj))",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaIf.c"
                            ,0x857,"void Gia_ManTransferPacking(Gia_Man_t *, Gia_Man_t *)");
            }
            if (p->vMapping->nSize <= (int)uVar7) goto LAB_00215693;
            if (p->vMapping->pArray[uVar7] == 0) {
              __assert_fail("Gia_ObjIsLut(p, Gia_ObjId(p, pObjNew))",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaIf.c"
                            ,0x858,"void Gia_ManTransferPacking(Gia_Man_t *, Gia_Man_t *)");
            }
            Vec_IntPush(pVVar2,uVar7);
            uVar8 = uVar8 + 1;
            Entry_00 = Entry_00 + -1;
          } while (Entry_00 != 0);
          uVar7 = (uint)uVar8;
        }
        uVar7 = uVar7 + 1;
        iVar6 = iVar6 + 1;
        pVVar4 = pGia->vPacking;
      } while ((int)uVar7 < pVVar4->nSize);
    }
    if (Entry != iVar6) {
      __assert_fail("nEntries == nEntries2",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaIf.c"
                    ,0x85f,"void Gia_ManTransferPacking(Gia_Man_t *, Gia_Man_t *)");
    }
    if (p->vPacking != (Vec_Int_t *)0x0) {
      __assert_fail("p->vPacking == NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaIf.c"
                    ,0x861,"void Gia_ManTransferPacking(Gia_Man_t *, Gia_Man_t *)");
    }
    p->vPacking = pVVar2;
  }
  return;
}

Assistant:

void Gia_ManTransferPacking( Gia_Man_t * p, Gia_Man_t * pGia )
{
    Vec_Int_t * vPackingNew;
    Gia_Obj_t * pObj, * pObjNew;
    int i, k, Entry, nEntries, nEntries2;
    if ( pGia->vPacking == NULL )
        return;
    nEntries = Vec_IntEntry( pGia->vPacking, 0 );
    nEntries2 = 0;
    // create new packing info
    vPackingNew = Vec_IntAlloc( Vec_IntSize(pGia->vPacking) );
    Vec_IntPush( vPackingNew, nEntries );
    Vec_IntForEachEntryStart( pGia->vPacking, Entry, i, 1 )
    {
        assert( Entry > 0 && Entry < 4 );
        Vec_IntPush( vPackingNew, Entry );
        i++;
        for ( k = 0; k < Entry; k++, i++ )
        {
            pObj = Gia_ManObj(pGia, Vec_IntEntry(pGia->vPacking, i));
            pObjNew = Gia_ManObj(p, Abc_Lit2Var(Gia_ObjValue(pObj)));
            assert( Gia_ObjIsLut(pGia, Gia_ObjId(pGia, pObj)) );
            assert( Gia_ObjIsLut(p, Gia_ObjId(p, pObjNew)) );
            Vec_IntPush( vPackingNew, Gia_ObjId(p, pObjNew) );
//            printf( "%d -> %d  ", Vec_IntEntry(pGia->vPacking, i), Gia_ObjId(p, pObjNew) );
        }
        i--;
        nEntries2++;
    }
    assert( nEntries == nEntries2 );
    // attach packing info
    assert( p->vPacking == NULL );
    p->vPacking = vPackingNew;
}